

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::deinit
          (BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
           *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration> *local_10
  ;
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
  *this_local;
  
  local_10 = this;
  if (this->m_dummyBufferID != 0) {
    pRVar2 = Context::getRenderContext
                       ((this->
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                        ).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1);
    this->m_dummyBufferID = 0;
  }
  memset(&local_28,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_zeroData,&local_28)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::deinit
            (&this->
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            );
  return;
}

Assistant:

void BasicUploadCase<SampleType>::deinit (void)
{
	if (m_dummyBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_dummyBufferID);
		m_dummyBufferID = 0;
	}

	m_zeroData = std::vector<deUint8>();

	BasicBufferCase<SampleType>::deinit();
}